

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerFunctionEntry(Lowerer *this,Instr *funcEntry)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  ArgSlot AVar5;
  int iVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *pJVar8;
  Instr *insertBeforeInstr;
  Instr *instr;
  HelperCallOpnd *this_00;
  RegOpnd *opndArg;
  undefined4 extraout_var;
  MemRefOpnd *dst;
  IntConstOpnd *src;
  
  if (funcEntry->m_opcode != FunctionEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6829,"(funcEntry->m_opcode == Js::OpCode::FunctionEntry)",
                       "funcEntry->m_opcode == Js::OpCode::FunctionEntry");
    if (!bVar3) goto LAB_005b1c88;
    *puVar7 = 0;
  }
  bVar3 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (bVar3) {
    return;
  }
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar8);
  if (bVar3) {
    return;
  }
  insertBeforeInstr = Func::GetFunctionEntryInsertionPoint(this->m_func);
  LowerFunctionBodyCallCountChange(this,insertBeforeInstr);
  bVar3 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (!bVar3) {
    return;
  }
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  AVar5 = JITTimeFunctionBody::GetInParamsCount(pJVar8);
  if (1 < AVar5) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar8);
    if (!bVar3) goto LAB_005b1c1f;
    instr = IR::Instr::New(Call,this->m_func);
    this_00 = IR::HelperCallOpnd::New(HelperSimpleProfileParameters,this->m_func);
    if (instr->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_005b1c88;
      *puVar7 = 0;
    }
    pFVar1 = instr->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_005b1c88:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    bVar4 = (this_00->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar4 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar4 | 2;
    instr->m_src1 = &this_00->super_Opnd;
    IR::Instr::InsertBefore(insertBeforeInstr,instr);
    opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
    LowererMD::LowerCall(&this->m_lowererMD,instr,0);
  }
LAB_005b1c1f:
  pFVar1 = this->m_func;
  iVar6 = (*pFVar1->m_threadContextInfo->_vptr_ThreadContextInfo[5])();
  dst = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar6),TyUint8,pFVar1,AddrOpndKindDynamicMisc);
  src = IR::IntConstOpnd::New(1,TyUint8,this->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void Lowerer::LowerFunctionEntry(IR::Instr* funcEntry)
{
    Assert(funcEntry->m_opcode == Js::OpCode::FunctionEntry);

    //Don't do a body call increment for loops or asm.js
    if (m_func->IsLoopBody() || m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = this->m_func->GetFunctionEntryInsertionPoint();

    LowerFunctionBodyCallCountChange(insertBeforeInstr);

    if (m_func->DoSimpleJitDynamicProfile())
    {
        // Only generate the argument profiling if the function expects to have some arguments to profile and only if
        //    it has implicit ArgIns (the latter is a restriction imposed by the Interpreter, so it is mirrored in SimpleJit)

        if (m_func->GetJITFunctionBody()->GetInParamsCount() > 1 && m_func->GetJITFunctionBody()->HasImplicitArgIns())
        {
            // Call out to the argument profiling helper
            IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, m_func);
            callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperSimpleProfileParameters, m_func));
            insertBeforeInstr->InsertBefore(callInstr);
            m_lowererMD.LoadHelperArgument(callInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LowerCall(callInstr, 0);
        }

        // Clear existing ImplicitCallFlags
        const auto starFlag = GetImplicitCallFlagsOpnd();
        this->InsertMove(starFlag, CreateClearImplicitCallFlagsOpnd(), insertBeforeInstr);
    }
}